

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space2.cpp
# Opt level: O1

void bomb_done_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  Am_Object bomb;
  Am_Object local_30;
  Am_Object_Method local_28;
  
  pAVar1 = (Am_Value *)Am_Object::Get(0x9220,0xca);
  Am_Object_Method::Am_Object_Method(&local_28,pAVar1);
  Am_Object::Am_Object(&local_30,cmd);
  (*local_28.Call)((Am_Object_Data *)&local_30);
  Am_Object::~Am_Object(&local_30);
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)cmd,0x193);
  Am_Object::Am_Object((Am_Object *)&local_28,pAVar1);
  Am_Object::~Am_Object((Am_Object *)&local_28);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, bomb_done, (Am_Object cmd))
{
  Am_Object_Method(Am_Animator.Get(Am_DO_METHOD)).Call(cmd);
  Am_Object bomb = cmd.Get(Am_OPERATES_ON);
}